

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qualengine.cpp
# Opt level: O2

void __thiscall QualEngine::solve(QualEngine *this,int tstep)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  
  if ((tstep != 0) && (this->engineState == INITIALIZED)) {
    uVar3 = (ulong)(uint)tstep;
    if ((this->qualTime == 0) || (bVar1 = flowDirectionsChanged(this), bVar1)) {
      sortLinks(this);
    }
    setSourceQuality(this);
    this->qualTime = this->qualTime + tstep;
    while (iVar2 = (int)uVar3, 0 < iVar2) {
      uVar4 = (ulong)(uint)this->qualStep;
      if (iVar2 < this->qualStep) {
        uVar4 = uVar3;
      }
      (*this->qualSolver->_vptr_QualSolver[4])
                (this->qualSolver,
                 (this->sortedLinks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,uVar4);
      uVar3 = (ulong)(uint)(iVar2 - (int)uVar4);
    }
  }
  return;
}

Assistant:

void QualEngine::solve(int tstep)
{
    // ... check that engine has been initialized

    if ( engineState != QualEngine::INITIALIZED ) return;
    if ( tstep == 0 ) return;

   // ... topologically sort the links if flow direction has changed

    if ( qualTime == 0 ) sortLinks();
    else if ( flowDirectionsChanged() ) sortLinks();

    // ... determine external source quality

    setSourceQuality();

    // ... propagate water quality through network over a sequence
    //     of water quality time steps

    qualTime += tstep;

    while ( tstep > 0 )
    {
        int qstep = min(qualStep, tstep);
        qualSolver->solve(&sortedLinks[0], qstep);
        tstep -= qstep;
    }
}